

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::verifyUniformMatrixValues<4>
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,
               GLfloat *values,bool transpose)

{
  ostringstream *this;
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  StateQueryMemoryWriteGuard<float[16]> state;
  StateQueryMemoryWriteGuard<float[16]> local_270;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  memset(&local_270,0xde,0xc0);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,local_270.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::verifyValidity
                    (&local_270,testCtx);
  if (bVar2) {
    this = (ostringstream *)(local_1b0 + 8);
    iVar1 = 0;
    uVar4 = 0;
    do {
      uVar6 = uVar4 & 0xffffffff;
      lVar5 = 0;
      do {
        iVar3 = iVar1 + (int)lVar5;
        if (transpose) {
          iVar3 = (int)uVar6;
        }
        if ((values[lVar5] != local_270.m_value[iVar3]) ||
           (NAN(values[lVar5]) || NAN(local_270.m_value[iVar3]))) {
          local_1b0._0_8_ = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,"// ERROR: at index [",0x14);
          std::ostream::operator<<(this,(int)uVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"][",2);
          std::ostream::operator<<(this,(int)lVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"] expected ",0xb);
          std::ostream::_M_insert<double>((double)values[lVar5]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
          std::ostream::_M_insert<double>((double)local_270.m_value[iVar3]);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
          std::ios_base::~ios_base(local_138);
          if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value")
            ;
          }
        }
        lVar5 = lVar5 + 1;
        uVar6 = (ulong)((int)uVar6 + 4);
      } while (lVar5 != 4);
      uVar4 = uVar4 + 1;
      iVar1 = iVar1 + 4;
      values = values + 4;
    } while (uVar4 != 4);
  }
  return;
}

Assistant:

void verifyUniformMatrixValues (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, const GLfloat* values, bool transpose)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[N*N]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	for (int y = 0; y < N; ++y)
		for (int x = 0; x < N; ++x)
		{
			const int refIndex = y*N + x;
			const int stateIndex = transpose ? (x*N + y) : (y*N + x);

			if (values[refIndex] != state[stateIndex])
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: at index [" << y << "][" << x << "] expected " << values[refIndex] << "; got " << state[stateIndex] << TestLog::EndMessage;

				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
			}
		}
}